

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateFunctionCall(ExpressionTranslateContext *ctx,ExprFunctionCall *expression)

{
  bool bVar1;
  ExprFunctionAccess *pEVar2;
  TypeFunction *pTVar3;
  ExprBase *local_40;
  ExprBase *value_1;
  TypeHandle *curr;
  TypeFunction *typeFunction;
  ExprBase *value;
  ExprFunctionAccess *functionAccess;
  ExprFunctionCall *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  pEVar2 = getType<ExprFunctionAccess>(expression->function);
  if (pEVar2 == (ExprFunctionAccess *)0x0) {
    pTVar3 = getType<TypeFunction>(expression->function->type);
    if (pTVar3 == (TypeFunction *)0x0) {
      __assert_fail("!\"unknwon type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x63b,
                    "void TranslateFunctionCall(ExpressionTranslateContext &, ExprFunctionCall *)");
    }
    Print(ctx,"((");
    TranslateTypeName(ctx,pTVar3->returnType);
    Print(ctx,"(*)(");
    for (value_1 = (ExprBase *)(pTVar3->arguments).head; value_1 != (ExprBase *)0x0;
        value_1 = *(ExprBase **)&value_1->typeID) {
      TranslateTypeName(ctx,(TypeBase *)value_1->_vptr_ExprBase);
      Print(ctx,", ");
    }
    Print(ctx,"void*))(*__nullcFM)[(");
    Translate(ctx,expression->function);
    Print(ctx,").id])(");
    for (local_40 = (expression->arguments).head; local_40 != (ExprBase *)0x0;
        local_40 = local_40->next) {
      Translate(ctx,local_40);
      Print(ctx,", ");
    }
    Print(ctx,"(");
    Translate(ctx,expression->function);
    Print(ctx,").context)");
  }
  else {
    TranslateFunctionName(ctx,pEVar2->function);
    bVar1 = UseNonStaticTemplate(ctx,pEVar2->function);
    if (bVar1) {
      Print(ctx,"<0>");
    }
    Print(ctx,"(");
    for (typeFunction = (TypeFunction *)(expression->arguments).head;
        typeFunction != (TypeFunction *)0x0;
        typeFunction = (TypeFunction *)(typeFunction->super_TypeBase).importModule) {
      Translate(ctx,(ExprBase *)typeFunction);
      Print(ctx,", ");
    }
    Translate(ctx,pEVar2->context);
    Print(ctx,")");
  }
  return;
}

Assistant:

void TranslateFunctionCall(ExpressionTranslateContext &ctx, ExprFunctionCall *expression)
{
	if(ExprFunctionAccess *functionAccess = getType<ExprFunctionAccess>(expression->function))
	{
		TranslateFunctionName(ctx, functionAccess->function);

		if(UseNonStaticTemplate(ctx, functionAccess->function))
			Print(ctx, "<0>");

		Print(ctx, "(");

		for(ExprBase *value = expression->arguments.head; value; value = value->next)
		{
			Translate(ctx, value);

			Print(ctx, ", ");
		}

		Translate(ctx, functionAccess->context);

		Print(ctx, ")");
	}
	else if(TypeFunction *typeFunction = getType<TypeFunction>(expression->function->type))
	{
		// TODO: side effects may be performed multiple times since the node is translated two times
		Print(ctx, "((");
		TranslateTypeName(ctx, typeFunction->returnType);
		Print(ctx, "(*)(");

		for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
		{
			TranslateTypeName(ctx, curr->type);

			Print(ctx, ", ");
		}

		Print(ctx, "void*))(*__nullcFM)[(");
		Translate(ctx, expression->function);
		Print(ctx, ").id])(");

		for(ExprBase *value = expression->arguments.head; value; value = value->next)
		{
			Translate(ctx, value);

			Print(ctx, ", ");
		}

		Print(ctx, "(");
		Translate(ctx, expression->function);
		Print(ctx, ").context)");
	}
	else
	{
		assert(!"unknwon type");
	}
}